

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void pnga_add_diagonal(Integer g_a,Integer g_v)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  Integer icode;
  int iVar6;
  Integer IVar7;
  double *buf;
  int *piVar8;
  float *pfVar9;
  undefined1 (*pauVar10) [16];
  long *plVar11;
  double *pdVar12;
  char *pcVar13;
  long lVar14;
  Integer iloA;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  char *ptr;
  Integer ld;
  Integer hiA [2];
  Integer loA [2];
  Integer atype;
  Integer vtype;
  Integer vdims;
  Integer vndim;
  Integer vlo;
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  char *local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  Integer local_380;
  long local_378;
  long local_370;
  long local_368;
  Integer local_360;
  Integer local_358;
  long local_350;
  long local_348;
  long local_340;
  _iterator_hdl local_330;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar3 = _ga_sync_end;
  bVar18 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar18) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_add_diagonal_");
  pnga_check_handle(g_v,"ga_add_diagonal_");
  pnga_inquire(g_a,&local_380,&local_350,&local_348);
  icode = local_380;
  pnga_inquire(g_v,&local_378,&local_368,&local_370);
  if (local_350 != 2) {
    pnga_error("ga_add_diagonal: wrong dimension for g_a.",local_350);
  }
  if (local_368 != 1) {
    pnga_error("ga_add_diagonal: wrong dimension for g_v.",local_368);
  }
  if (local_348 < local_340) {
    local_340 = local_348;
  }
  if (local_370 != local_340) {
    pnga_error("ga_add_diagonal: The size of the first array\'s diagonal is greater than the size of the second array."
               ,icode);
  }
  if (local_378 != local_380) {
    pnga_error("ga_add_diagonal: input global arrays do not have the same data type. Global array type ="
               ,local_380);
  }
  pnga_local_iterator_init(g_a,&local_330);
  iVar6 = pnga_local_iterator_next(&local_330,&local_398,&local_3a8,&local_3b8,&local_3b0);
  if (iVar6 != 0) {
    local_388 = icode + -0x3e9;
    do {
      lVar5 = local_390;
      lVar14 = local_398;
      lVar4 = local_3b0;
      pcVar13 = local_3b8;
      if (0 < local_398) {
        lVar16 = local_390;
        if (local_390 < local_398) {
          lVar16 = local_398;
        }
        lVar15 = local_3a0;
        if (local_3a8 < local_3a0) {
          lVar15 = local_3a8;
        }
        lVar17 = lVar15 - lVar16;
        if (lVar16 <= lVar15) {
          IVar7 = GAsizeof(icode);
          lVar15 = lVar17 + 1;
          buf = (double *)malloc(IVar7 * lVar15);
          if (buf == (double *)0x0) {
            pnga_error("ga_add_diagonal_:failed to allocate memory for the local buffer.",0);
          }
          pnga_get(g_v,&local_358,&local_360,buf,&local_360);
          switch(local_388) {
          case 0:
            if (-1 < lVar17) {
              piVar8 = (int *)(pcVar13 + (lVar16 - lVar5) * lVar4 * 4 + (lVar16 - lVar14) * 4);
              lVar14 = 0;
              do {
                *piVar8 = *piVar8 + *(int *)((long)buf + lVar14 * 4);
                lVar14 = lVar14 + 1;
                piVar8 = piVar8 + lVar4 + 1;
              } while (lVar17 + 1 != lVar14);
            }
            break;
          case 1:
            if (-1 < lVar17) {
              plVar11 = (long *)(pcVar13 + (lVar16 - lVar5) * lVar4 * 8 + (lVar16 - lVar14) * 8);
              lVar14 = 0;
              do {
                *plVar11 = *plVar11 + (long)buf[lVar14];
                lVar14 = lVar14 + 1;
                plVar11 = plVar11 + lVar4 + 1;
              } while (lVar17 + 1 != lVar14);
            }
            break;
          case 2:
            if (-1 < lVar17) {
              pfVar9 = (float *)(pcVar13 + (lVar16 - lVar5) * lVar4 * 4 + (lVar16 - lVar14) * 4);
              lVar14 = 0;
              do {
                *pfVar9 = *(float *)((long)buf + lVar14 * 4) + *pfVar9;
                lVar14 = lVar14 + 1;
                pfVar9 = pfVar9 + lVar4 + 1;
              } while (lVar17 + 1 != lVar14);
            }
            break;
          case 3:
            if (-1 < lVar17) {
              pdVar12 = (double *)(pcVar13 + (lVar16 - lVar5) * lVar4 * 8 + (lVar16 - lVar14) * 8);
              lVar14 = 0;
              do {
                *pdVar12 = buf[lVar14] + *pdVar12;
                lVar14 = lVar14 + 1;
                pdVar12 = pdVar12 + lVar4 + 1;
              } while (lVar17 + 1 != lVar14);
            }
            break;
          default:
            pnga_error("ga_add_diagonal_: wrong data type:",icode);
            break;
          case 5:
            if (-1 < lVar17) {
              pcVar13 = pcVar13 + (lVar16 - lVar5) * lVar4 * 8 + (lVar16 - lVar14) * 8;
              lVar14 = 0;
              do {
                *(ulong *)pcVar13 =
                     CONCAT44((float)((ulong)*(undefined8 *)pcVar13 >> 0x20) +
                              (float)((ulong)buf[lVar14] >> 0x20),
                              (float)*(undefined8 *)pcVar13 + SUB84(buf[lVar14],0));
                lVar14 = lVar14 + 1;
                pcVar13 = pcVar13 + lVar4 * 8 + 8;
              } while (lVar17 + 1 != lVar14);
            }
            break;
          case 6:
            if (-1 < lVar17) {
              pauVar10 = (undefined1 (*) [16])
                         (pcVar13 + (lVar16 - lVar5) * lVar4 * 0x10 + (lVar16 - lVar14) * 0x10);
              pdVar12 = buf;
              do {
                dVar2 = *(double *)(*pauVar10 + 8) + pdVar12[1];
                auVar1._8_4_ = SUB84(dVar2,0);
                auVar1._0_8_ = *(double *)*pauVar10 + *pdVar12;
                auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
                *pauVar10 = auVar1;
                pauVar10 = pauVar10 + lVar4 + 1;
                pdVar12 = pdVar12 + 2;
                lVar15 = lVar15 + -1;
              } while (lVar15 != 0);
            }
          }
          free(buf);
        }
      }
      iVar6 = pnga_local_iterator_next(&local_330,&local_398,&local_3a8,&local_3b8,&local_3b0);
    } while (iVar6 != 0);
  }
  if (iVar3 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_add_diagonal(Integer g_a, Integer g_v)
{
  Integer vndim, vdims, dim1, dim2, vtype, atype, type;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  Integer andim, adims[2];
  Integer loA[2], hiA[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  char *ptr;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_add_diagonal_");
  pnga_check_handle (g_v, "ga_add_diagonal_");

  pnga_inquire(g_a, &atype, &andim, adims);
  dim1 = adims[0];
  dim2 = adims[1];
  type = atype;
  pnga_inquire(g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_add_diagonal: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_add_diagonal: wrong dimension for g_v.", vndim);


  if (vdims != GA_MIN (dim1, dim2))
    pnga_error
      ("ga_add_diagonal: The size of the first array's diagonal is greater than the size of the second array.",
       type);

  if (vtype != atype)
  {
    pnga_error
      ("ga_add_diagonal: input global arrays do not have the same data type. Global array type =",
       atype);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_add_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_add_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_add_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_add_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}